

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::startsWith(string *s,string *prefix)

{
  char *__first1;
  bool bVar1;
  
  if (s->_M_string_length < prefix->_M_string_length) {
    return false;
  }
  __first1 = (prefix->_M_dataplus)._M_p;
  bVar1 = clara::std::__equal<true>::equal<char>
                    (__first1,__first1 + prefix->_M_string_length,(s->_M_dataplus)._M_p);
  return bVar1;
}

Assistant:

bool startsWith( std::string const& s, std::string const& prefix ) {
        return s.size() >= prefix.size() && std::equal(prefix.begin(), prefix.end(), s.begin());
    }